

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int lyxp_node_atomize(lys_node *node,lyxp_set *set,int warn_on_fwd_ref)

{
  int iVar1;
  uint8_t *puVar2;
  LY_ERR *pLVar3;
  LY_VECODE *pLVar4;
  char *pcVar5;
  bool bVar6;
  char *path;
  lys_restr *must;
  lys_when *when;
  int ret;
  int opts;
  uint32_t i;
  uint8_t must_size;
  lyxp_set tmp_set;
  lyxp_node_type local_2c;
  lys_node *plStack_28;
  lyxp_node_type ctx_snode_type;
  lys_node *ctx_snode;
  lyxp_set *plStack_18;
  int warn_on_fwd_ref_local;
  lyxp_set *set_local;
  lys_node *node_local;
  
  opts._3_1_ = 0;
  when._0_4_ = 0;
  must = (lys_restr *)0x0;
  path = (char *)0x0;
  ctx_snode._4_4_ = warn_on_fwd_ref;
  plStack_18 = set;
  set_local = (lyxp_set *)node;
  if ((warn_on_fwd_ref != 0) && (puVar2 = ly_vlog_hide_location(), *puVar2 != '\0')) {
    __assert_fail("!warn_on_fwd_ref || !*ly_vlog_hide_location()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x1dfe,"int lyxp_node_atomize(const struct lys_node *, struct lyxp_set *, int)");
  }
  memset(&i,0,0x30);
  memset(plStack_18,0,0x30);
  when._4_4_ = 0;
  plStack_28 = (lys_node *)set_local;
  while( true ) {
    bVar6 = false;
    if (plStack_28 != (lys_node *)0x0) {
      bVar6 = plStack_28->nodetype != LYS_OUTPUT;
    }
    if (!bVar6) break;
    plStack_28 = lys_parent(plStack_28);
  }
  if (plStack_28 != (lys_node *)0x0) {
    when._4_4_ = 0x20;
  }
  iVar1 = *(int *)&set_local[1].field_0x8;
  if (iVar1 == 1) {
    must = *(lys_restr **)&set_local[2].field_0x8;
    path = set_local[2].val.str;
    opts._3_1_ = (set_local->val).field6[0xe];
  }
  else if (iVar1 == 2) {
    must = *(lys_restr **)&set_local[2].field_0x8;
  }
  else if (iVar1 == 4) {
    must = *(lys_restr **)&set_local[2].field_0x8;
    path = set_local[2].val.str;
    opts._3_1_ = (set_local->val).field6[0xf];
  }
  else if (iVar1 == 8) {
    must = *(lys_restr **)&set_local[2].field_0x8;
    path = set_local[2].val.str;
    opts._3_1_ = (set_local->val).field6[0xf];
  }
  else if (iVar1 == 0x10) {
    must = *(lys_restr **)&set_local[2].field_0x8;
    path = set_local[2].val.str;
    opts._3_1_ = (set_local->val).field6[0xc];
  }
  else if (iVar1 == 0x20) {
LAB_00198831:
    must = *(lys_restr **)&set_local[2].field_0x8;
    path = set_local[2].val.str;
    opts._3_1_ = (set_local->val).field6[0xf];
  }
  else if (iVar1 == 0x40) {
    must = *(lys_restr **)&set_local[2].field_0x8;
  }
  else if (iVar1 == 0x80) {
    path = set_local[2].val.str;
    opts._3_1_ = (set_local->val).field6[0xf];
  }
  else if ((iVar1 == 0x200) || (iVar1 == 0x400)) {
    path = set_local[2].val.str;
    opts._3_1_ = (set_local->val).field6[0xf];
  }
  else if (iVar1 == 0x1000) {
    must = *(lys_restr **)&set_local[2].field_0x8;
  }
  else if (iVar1 == 0x2000) {
    must = *(lys_restr **)&set_local[1].used;
  }
  else if (iVar1 == 0x8020) goto LAB_00198831;
  if (ctx_snode._4_4_ != 0) {
    ly_vlog_hide('\x01');
  }
  if (must != (lys_restr *)0x0) {
    resolve_when_ctx_snode((lys_node *)set_local,&stack0xffffffffffffffd8,&local_2c);
    iVar1 = lyxp_atomize(must->expr,plStack_28,local_2c,(lyxp_set *)&i,when._4_4_ | 0x10);
    if (iVar1 == 0) {
      set_snode_merge(plStack_18,(lyxp_set *)&i);
      memset(&i,0,0x30);
    }
    else {
      free((void *)tmp_set._8_8_);
      pLVar3 = ly_errno_location();
      if ((*pLVar3 != LY_EVALID) ||
         ((pLVar4 = ly_vecode_location(), *pLVar4 != LYVE_XPATH_INSNODE &&
          (pLVar4 = ly_vecode_location(), *pLVar4 != LYVE_XPATH_INMOD)))) {
        ly_vlog(LYE_SPEC,LY_VLOG_LYS,set_local,"Invalid when condition \"%s\".",must->expr);
        when._0_4_ = -1;
        goto LAB_00198c05;
      }
      if (ctx_snode._4_4_ == 0) {
        ly_vlog(LYE_SPEC,LY_VLOG_LYS,set_local,"Invalid when condition \"%s\".",must->expr);
        when._0_4_ = 1;
        goto LAB_00198c05;
      }
      ly_vlog_hide('\0');
      if ('\0' < ly_log_level) {
        pcVar5 = ly_errmsg();
        ly_log(LY_LLWRN,pcVar5);
      }
      pcVar5 = lys_path((lys_node *)set_local);
      if ('\0' < ly_log_level) {
        ly_log(LY_LLWRN,"Invalid when condition \"%s\". (%s)",must->expr,pcVar5);
      }
      free(pcVar5);
      ly_vlog_hide('\x01');
      when._0_4_ = 1;
      memset(&i,0,0x30);
    }
  }
  for (ret = 0; (uint)ret < (uint)opts._3_1_; ret = ret + 1) {
    iVar1 = lyxp_atomize(*(char **)(path + (ulong)(uint)ret * 0x38),(lys_node *)set_local,
                         LYXP_NODE_ELEM,(lyxp_set *)&i,when._4_4_ | 8);
    if (iVar1 == 0) {
      set_snode_merge(plStack_18,(lyxp_set *)&i);
      memset(&i,0,0x30);
    }
    else {
      free((void *)tmp_set._8_8_);
      pLVar3 = ly_errno_location();
      if ((*pLVar3 != LY_EVALID) || (pLVar4 = ly_vecode_location(), *pLVar4 != LYVE_XPATH_INSNODE))
      {
        ly_vlog(LYE_SPEC,LY_VLOG_LYS,set_local,"Invalid must restriction \"%s\".",
                *(undefined8 *)(path + (ulong)(uint)ret * 0x38));
        when._0_4_ = -1;
        break;
      }
      if (ctx_snode._4_4_ == 0) {
        ly_vlog(LYE_SPEC,LY_VLOG_LYS,set_local,"Invalid must restriction \"%s\".",
                *(undefined8 *)(path + (ulong)(uint)ret * 0x38));
        when._0_4_ = 1;
        break;
      }
      ly_vlog_hide('\0');
      if ('\0' < ly_log_level) {
        pcVar5 = ly_errmsg();
        ly_log(LY_LLWRN,pcVar5);
      }
      pcVar5 = lys_path((lys_node *)set_local);
      if ('\0' < ly_log_level) {
        ly_log(LY_LLWRN,"Invalid must restriction \"%s\". (%s)",
               *(undefined8 *)(path + (ulong)(uint)ret * 0x38),pcVar5);
      }
      free(pcVar5);
      ly_vlog_hide('\x01');
      when._0_4_ = 1;
      memset(&i,0,0x30);
    }
  }
LAB_00198c05:
  if (ctx_snode._4_4_ != 0) {
    ly_vlog_hide('\0');
  }
  if ((int)when != 0) {
    free((plStack_18->val).nodes);
    memset(plStack_18,0,0x30);
  }
  return (int)when;
}

Assistant:

int
lyxp_node_atomize(const struct lys_node *node, struct lyxp_set *set, int warn_on_fwd_ref)
{
    struct lys_node *ctx_snode;
    enum lyxp_node_type ctx_snode_type;
    struct lyxp_set tmp_set;
    uint8_t must_size = 0;
    uint32_t i;
    int opts, ret = EXIT_SUCCESS;
    struct lys_when *when = NULL;
    struct lys_restr *must = NULL;
    char *path;

    assert(!warn_on_fwd_ref || !*ly_vlog_hide_location());

    memset(&tmp_set, 0, sizeof tmp_set);
    memset(set, 0, sizeof *set);

    /* check if we will be traversing RPC output */
    opts = 0;
    for (ctx_snode = (struct lys_node *)node; ctx_snode && (ctx_snode->nodetype != LYS_OUTPUT); ctx_snode = lys_parent(ctx_snode));
    if (ctx_snode) {
        opts |= LYXP_SNODE_OUTPUT;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        when = ((struct lys_node_container *)node)->when;
        must = ((struct lys_node_container *)node)->must;
        must_size = ((struct lys_node_container *)node)->must_size;
        break;
    case LYS_CHOICE:
        when = ((struct lys_node_choice *)node)->when;
        break;
    case LYS_LEAF:
        when = ((struct lys_node_leaf *)node)->when;
        must = ((struct lys_node_leaf *)node)->must;
        must_size = ((struct lys_node_leaf *)node)->must_size;
        break;
    case LYS_LEAFLIST:
        when = ((struct lys_node_leaflist *)node)->when;
        must = ((struct lys_node_leaflist *)node)->must;
        must_size = ((struct lys_node_leaflist *)node)->must_size;
        break;
    case LYS_LIST:
        when = ((struct lys_node_list *)node)->when;
        must = ((struct lys_node_list *)node)->must;
        must_size = ((struct lys_node_list *)node)->must_size;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        when = ((struct lys_node_anydata *)node)->when;
        must = ((struct lys_node_anydata *)node)->must;
        must_size = ((struct lys_node_anydata *)node)->must_size;
        break;
    case LYS_CASE:
        when = ((struct lys_node_case *)node)->when;
        break;
    case LYS_NOTIF:
        must = ((struct lys_node_notif *)node)->must;
        must_size = ((struct lys_node_notif *)node)->must_size;
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        must = ((struct lys_node_inout *)node)->must;
        must_size = ((struct lys_node_inout *)node)->must_size;
        break;
    case LYS_USES:
        when = ((struct lys_node_uses *)node)->when;
        break;
    case LYS_AUGMENT:
        when = ((struct lys_node_augment *)node)->when;
        break;
    default:
        /* nothing to check */
        break;
    }

    if (warn_on_fwd_ref) {
        /* hide errors, we can print only warnings */
        ly_vlog_hide(1);
    }

    /* check "when" */
    if (when) {
        resolve_when_ctx_snode(node, &ctx_snode, &ctx_snode_type);
        if (lyxp_atomize(when->cond, ctx_snode, ctx_snode_type, &tmp_set, LYXP_SNODE_WHEN | opts)) {
            free(tmp_set.val.snodes);
            if ((ly_errno != LY_EVALID) || ((ly_vecode != LYVE_XPATH_INSNODE) && (ly_vecode != LYVE_XPATH_INMOD))) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Invalid when condition \"%s\".", when->cond);
                ret = -1;
                goto finish;
            } else if (!warn_on_fwd_ref) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Invalid when condition \"%s\".", when->cond);
                ret = EXIT_FAILURE;
                goto finish;
            }
            ly_vlog_hide(0);
            LOGWRN(ly_errmsg());
            path = lys_path(node);
            LOGWRN("Invalid when condition \"%s\". (%s)", when->cond, path);
            free(path);
            ly_vlog_hide(1);

            ret = EXIT_FAILURE;
            memset(&tmp_set, 0, sizeof tmp_set);
        } else {
            set_snode_merge(set, &tmp_set);
            memset(&tmp_set, 0, sizeof tmp_set);
        }
    }

    /* check "must" */
    for (i = 0; i < must_size; ++i) {
        if (lyxp_atomize(must[i].expr, node, LYXP_NODE_ELEM, &tmp_set, LYXP_SNODE_MUST | opts)) {
            free(tmp_set.val.snodes);
            if ((ly_errno != LY_EVALID) || (ly_vecode != LYVE_XPATH_INSNODE)) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Invalid must restriction \"%s\".", must[i].expr);
                ret = -1;
                goto finish;
            } else if (!warn_on_fwd_ref) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Invalid must restriction \"%s\".", must[i].expr);
                ret = EXIT_FAILURE;
                goto finish;
            }
            ly_vlog_hide(0);
            LOGWRN(ly_errmsg());
            path = lys_path(node);
            LOGWRN("Invalid must restriction \"%s\". (%s)", must[i].expr, path);
            free(path);
            ly_vlog_hide(1);

            ret = EXIT_FAILURE;
            memset(&tmp_set, 0, sizeof tmp_set);
        } else {
            set_snode_merge(set, &tmp_set);
            memset(&tmp_set, 0, sizeof tmp_set);
        }
    }

finish:
    if (warn_on_fwd_ref) {
        ly_vlog_hide(0);
    }
    if (ret) {
        free(set->val.snodes);
        memset(set, 0, sizeof *set);
    }
    return ret;
}